

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_quic_transport_params_add_serverhello_impl
               (SSL_HANDSHAKE *hs,CBB *out,bool use_legacy_codepoint)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint16_t value;
  CBB contents;
  CBB local_50;
  
  iVar1 = SSL_is_quic(hs->ssl);
  bVar3 = true;
  if (iVar1 != 0 || !use_legacy_codepoint) {
    iVar1 = SSL_is_quic(hs->ssl);
    if (iVar1 == 0) {
      __assert_fail("SSL_is_quic(hs->ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xb49,
                    "bool bssl::ext_quic_transport_params_add_serverhello_impl(SSL_HANDSHAKE *, CBB *, bool)"
                   );
    }
    if ((hs->config->quic_transport_params).size_ == 0) {
      bVar3 = false;
      ERR_put_error(0x10,0,0x131,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xb4c);
    }
    else {
      uVar2 = *(ushort *)&hs->config->field_0x10d & 0x200;
      if ((ushort)(uVar2 >> 9) == (ushort)use_legacy_codepoint) {
        value = 0xffa5;
        if ((short)uVar2 == 0) {
          value = 0x39;
        }
        iVar1 = CBB_add_u16(out,value);
        if (((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(out,&local_50), iVar1 != 0)) &&
           (iVar1 = CBB_add_bytes(&local_50,(hs->config->quic_transport_params).data_,
                                  (hs->config->quic_transport_params).size_), iVar1 != 0)) {
          iVar1 = CBB_flush(out);
          return iVar1 != 0;
        }
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

static bool ext_quic_transport_params_add_serverhello_impl(
    SSL_HANDSHAKE *hs, CBB *out, bool use_legacy_codepoint) {
  if (!SSL_is_quic(hs->ssl) && use_legacy_codepoint) {
    // Ignore the legacy private-use codepoint because that could be sent
    // to mean something else than QUIC transport parameters.
    return true;
  }
  assert(SSL_is_quic(hs->ssl));
  if (hs->config->quic_transport_params.empty()) {
    // Transport parameters must be set when using QUIC.
    OPENSSL_PUT_ERROR(SSL, SSL_R_QUIC_TRANSPORT_PARAMETERS_MISCONFIGURED);
    return false;
  }
  if (use_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
    // Do nothing, we'll send the other codepoint.
    return true;
  }

  uint16_t extension_type = TLSEXT_TYPE_quic_transport_parameters;
  if (hs->config->quic_use_legacy_codepoint) {
    extension_type = TLSEXT_TYPE_quic_transport_parameters_legacy;
  }

  CBB contents;
  if (!CBB_add_u16(out, extension_type) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_bytes(&contents, hs->config->quic_transport_params.data(),
                     hs->config->quic_transport_params.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}